

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

void __thiscall llvm::Triple::setEnvironmentName(Triple *this,StringRef Str)

{
  Child LHS;
  Child LHS_00;
  Child LHS_01;
  Child CVar1;
  Child CVar2;
  Child CVar3;
  Child CVar4;
  Child CVar5;
  NodeKind NVar6;
  Child CVar7;
  Child CVar8;
  Child local_188 [2];
  undefined2 local_178;
  undefined6 uStack_176;
  Child local_168 [2];
  undefined2 local_158;
  undefined6 uStack_156;
  Child local_148 [2];
  undefined2 local_138;
  undefined6 uStack_136;
  Child local_128 [2];
  undefined2 local_118;
  undefined6 uStack_116;
  Twine local_108;
  undefined4 local_e8;
  undefined4 uStack_e4;
  NodeKind local_d8;
  char cStack_d7;
  undefined6 uStack_d6;
  uint local_d0;
  undefined4 uStack_cc;
  NodeKind local_c0;
  char cStack_bf;
  undefined6 uStack_be;
  uint local_b8;
  undefined4 uStack_b4;
  NodeKind local_a8;
  char cStack_a7;
  undefined6 uStack_a6;
  uint local_a0;
  undefined4 uStack_9c;
  NodeKind local_90;
  char cStack_8f;
  undefined6 uStack_8e;
  uint local_88;
  undefined4 uStack_84;
  NodeKind local_78;
  char cStack_77;
  undefined6 uStack_76;
  uint local_70;
  undefined4 uStack_6c;
  NodeKind local_60;
  char cStack_5f;
  undefined6 uStack_5e;
  StringRef local_58;
  StringRef local_48;
  StringRef local_38;
  StringRef local_28;
  
  local_58.Length = Str.Length;
  local_58.Data = Str.Data;
  local_28 = getArchName(this);
  Twine::Twine((Twine *)&local_70,&local_28,"-");
  local_38 = getVendorName(this);
  Twine::Twine((Twine *)&local_88,&local_38);
  if ((local_60 == NullKind) || (local_78 == NullKind)) {
    local_178 = 0x100;
  }
  else if (local_60 == EmptyKind) {
    local_178._1_1_ = cStack_77;
    local_178._0_1_ = local_78;
    uStack_176 = uStack_76;
    local_188[0]._0_4_ = local_88;
    local_188[0]._4_4_ = uStack_84;
  }
  else if (local_78 == EmptyKind) {
    local_178._1_1_ = cStack_5f;
    local_178._0_1_ = local_60;
    uStack_176 = uStack_5e;
    local_188[0]._0_4_ = local_70;
    local_188[0]._4_4_ = uStack_6c;
  }
  else {
    CVar7._4_4_ = uStack_6c;
    CVar7.decUI = local_70;
    if (cStack_5f != '\x01') {
      local_60 = TwineKind;
      CVar7.twine = (Twine *)&local_70;
    }
    if (cStack_77 != '\x01') {
      local_78 = TwineKind;
    }
    CVar5._4_4_ = uStack_84;
    CVar5.decUI = local_88;
    CVar8.twine = (Twine *)&local_88;
    if (cStack_77 == '\x01') {
      CVar8 = CVar5;
    }
    Twine::Twine((Twine *)local_188,CVar7,local_60,CVar8,local_78);
  }
  Twine::Twine((Twine *)&local_a0,"-");
  if (((NodeKind)local_178 == NullKind) || (local_90 == NullKind)) {
    local_158 = 0x100;
  }
  else if ((NodeKind)local_178 == EmptyKind) {
    local_158._1_1_ = cStack_8f;
    local_158._0_1_ = local_90;
    uStack_156 = uStack_8e;
    local_168[0]._0_4_ = local_a0;
    local_168[0]._4_4_ = uStack_9c;
  }
  else if (local_90 == EmptyKind) {
    local_158._0_1_ = (NodeKind)local_178;
    local_158._1_1_ = local_178._1_1_;
    uStack_156 = uStack_176;
    local_168[0].decUI = local_188[0].decUI;
    local_168[0]._4_4_ = local_188[0]._4_4_;
  }
  else {
    CVar8._4_4_ = local_188[0]._4_4_;
    CVar8.decUI = local_188[0].decUI;
    NVar6 = (NodeKind)local_178;
    if (local_178._1_1_ != EmptyKind) {
      CVar8.twine = (Twine *)local_188;
      NVar6 = TwineKind;
    }
    if (cStack_8f != '\x01') {
      local_90 = TwineKind;
    }
    CVar4._4_4_ = uStack_9c;
    CVar4.decUI = local_a0;
    CVar7.twine = (Twine *)&local_a0;
    if (cStack_8f == '\x01') {
      CVar7 = CVar4;
    }
    Twine::Twine((Twine *)local_168,CVar8,NVar6,CVar7,local_90);
  }
  local_48 = getOSName(this);
  Twine::Twine((Twine *)&local_b8,&local_48);
  if (((NodeKind)local_158 == NullKind) || (local_a8 == NullKind)) {
    local_138 = 0x100;
  }
  else if ((NodeKind)local_158 == EmptyKind) {
    local_138._1_1_ = cStack_a7;
    local_138._0_1_ = local_a8;
    uStack_136 = uStack_a6;
    local_148[0]._0_4_ = local_b8;
    local_148[0]._4_4_ = uStack_b4;
  }
  else if (local_a8 == EmptyKind) {
    local_138._0_1_ = (NodeKind)local_158;
    local_138._1_1_ = local_158._1_1_;
    uStack_136 = uStack_156;
    local_148[0].decUI = local_168[0].decUI;
    local_148[0]._4_4_ = local_168[0]._4_4_;
  }
  else {
    LHS._4_4_ = local_168[0]._4_4_;
    LHS.decUI = local_168[0].decUI;
    NVar6 = (NodeKind)local_158;
    if (local_158._1_1_ != EmptyKind) {
      LHS.twine = (Twine *)local_168;
      NVar6 = TwineKind;
    }
    if (cStack_a7 != '\x01') {
      local_a8 = TwineKind;
    }
    CVar3._4_4_ = uStack_b4;
    CVar3.decUI = local_b8;
    CVar7.twine = (Twine *)&local_b8;
    if (cStack_a7 == '\x01') {
      CVar7 = CVar3;
    }
    Twine::Twine((Twine *)local_148,LHS,NVar6,CVar7,local_a8);
  }
  Twine::Twine((Twine *)&local_d0,"-");
  if (((NodeKind)local_138 == NullKind) || (local_c0 == NullKind)) {
    local_118 = 0x100;
  }
  else if ((NodeKind)local_138 == EmptyKind) {
    local_118._1_1_ = cStack_bf;
    local_118._0_1_ = local_c0;
    uStack_116 = uStack_be;
    local_128[0]._0_4_ = local_d0;
    local_128[0]._4_4_ = uStack_cc;
  }
  else if (local_c0 == EmptyKind) {
    local_118._0_1_ = (NodeKind)local_138;
    local_118._1_1_ = local_138._1_1_;
    uStack_116 = uStack_136;
    local_128[0].decUI = local_148[0].decUI;
    local_128[0]._4_4_ = local_148[0]._4_4_;
  }
  else {
    LHS_00._4_4_ = local_148[0]._4_4_;
    LHS_00.decUI = local_148[0].decUI;
    NVar6 = (NodeKind)local_138;
    if (local_138._1_1_ != EmptyKind) {
      LHS_00.twine = (Twine *)local_148;
      NVar6 = TwineKind;
    }
    if (cStack_bf != '\x01') {
      local_c0 = TwineKind;
    }
    CVar2._4_4_ = uStack_cc;
    CVar2.decUI = local_d0;
    CVar7.twine = (Twine *)&local_d0;
    if (cStack_bf == '\x01') {
      CVar7 = CVar2;
    }
    Twine::Twine((Twine *)local_128,LHS_00,NVar6,CVar7,local_c0);
  }
  Twine::Twine((Twine *)&local_e8,&local_58);
  if (((NodeKind)local_118 == NullKind) || (local_d8 == NullKind)) {
    local_108._16_2_ = 0x100;
  }
  else if ((NodeKind)local_118 == EmptyKind) {
    local_108.RHSKind = cStack_d7;
    local_108.LHSKind = local_d8;
    local_108._18_6_ = uStack_d6;
  }
  else if (local_d8 == EmptyKind) {
    local_108.LHSKind = (NodeKind)local_118;
    local_108.RHSKind = local_118._1_1_;
    local_108._18_6_ = uStack_116;
  }
  else {
    LHS_01._4_4_ = local_128[0]._4_4_;
    LHS_01.decUI = local_128[0].decUI;
    NVar6 = (NodeKind)local_118;
    if (local_118._1_1_ != EmptyKind) {
      LHS_01.twine = (Twine *)local_128;
      NVar6 = TwineKind;
    }
    if (cStack_d7 != '\x01') {
      local_d8 = TwineKind;
    }
    CVar1._4_4_ = uStack_e4;
    CVar1.decUI = local_e8;
    CVar7.twine = (Twine *)&local_e8;
    if (cStack_d7 == '\x01') {
      CVar7 = CVar1;
    }
    Twine::Twine(&local_108,LHS_01,NVar6,CVar7,local_d8);
  }
  setTriple(this,&local_108);
  return;
}

Assistant:

void Triple::setEnvironmentName(StringRef Str) {
  setTriple(getArchName() + "-" + getVendorName() + "-" + getOSName() +
            "-" + Str);
}